

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O2

long duckdb::DateDiff::QuarterOperator::Operation<duckdb::date_t,duckdb::date_t,long>
               (date_t startdate,date_t enddate)

{
  int32_t end_day;
  int32_t end_month;
  int32_t end_year;
  int32_t start_day;
  int32_t start_month;
  int32_t start_year;
  
  Date::Convert(startdate,&start_year,&start_month,&start_day);
  Date::Convert(enddate,&end_year,&end_month,&end_day);
  return (long)((start_year * 0xc + start_month + -1) / -3 + (end_year * 0xc + end_month + -1) / 3);
}

Assistant:

static inline TR Operation(TA startdate, TB enddate) {
			int32_t start_year, start_month, start_day;
			Date::Convert(startdate, start_year, start_month, start_day);
			int32_t end_year, end_month, end_day;
			Date::Convert(enddate, end_year, end_month, end_day);

			return (end_year * 12 + end_month - 1) / Interval::MONTHS_PER_QUARTER -
			       (start_year * 12 + start_month - 1) / Interval::MONTHS_PER_QUARTER;
		}